

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O1

IntersecRes * intersectionT(IntersecRes *__return_storage_ptr__,Segment *segment,Triangle *triangle)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  
  uVar2 = (segment->b).x;
  uVar6 = (segment->b).y;
  fVar21 = (float)uVar6 - (segment->a).y;
  fVar18 = (segment->b).z - (segment->a).z;
  fVar15 = (float)uVar2 - (segment->a).x;
  fVar10 = fVar18 * fVar18 + fVar15 * fVar15 + fVar21 * fVar21;
  if (fVar10 < 0.0) {
    fVar10 = sqrtf(fVar10);
  }
  else {
    fVar10 = SQRT(fVar10);
  }
  fVar15 = fVar15 / fVar10;
  fVar21 = fVar21 / fVar10;
  fVar18 = fVar18 / fVar10;
  uVar3 = (triangle->y).x;
  uVar7 = (triangle->y).y;
  fVar10 = (triangle->x).x;
  fVar19 = (triangle->x).y;
  fVar14 = (float)uVar3 - fVar10;
  fVar13 = (float)uVar7 - fVar19;
  fVar23 = (triangle->x).z;
  fVar17 = (triangle->y).z - fVar23;
  uVar4 = (triangle->z).x;
  uVar8 = (triangle->z).y;
  fVar11 = (float)uVar4 - fVar10;
  fVar12 = (float)uVar8 - fVar19;
  fVar22 = (triangle->z).z - fVar23;
  fVar24 = fVar21 * fVar22 - fVar18 * fVar12;
  fVar25 = fVar18 * fVar11 - fVar22 * fVar15;
  fVar20 = fVar15 * fVar12 - fVar11 * fVar21;
  fVar16 = fVar17 * fVar20 + fVar14 * fVar24 + fVar13 * fVar25;
  if (1.1920929e-07 <= ABS(fVar16)) {
    fVar16 = 1.0 / fVar16;
    uVar5 = (segment->a).x;
    uVar9 = (segment->a).y;
    fVar1 = (segment->a).z;
    fVar10 = (float)uVar5 - fVar10;
    fVar19 = (float)uVar9 - fVar19;
    fVar23 = fVar1 - fVar23;
    fVar20 = (fVar20 * fVar23 + fVar24 * fVar10 + fVar25 * fVar19) * fVar16;
    if ((0.0 <= fVar20) && (fVar20 <= 1.0)) {
      fVar24 = fVar19 * fVar17 - fVar23 * fVar13;
      fVar23 = fVar23 * fVar14 - fVar17 * fVar10;
      fVar19 = fVar10 * fVar13 - fVar14 * fVar19;
      fVar10 = (fVar18 * fVar19 + fVar15 * fVar24 + fVar21 * fVar23) * fVar16;
      if ((0.0 <= fVar10) &&
         ((fVar20 + fVar10 <= 1.0 &&
          (fVar16 = fVar16 * (fVar22 * fVar19 + fVar11 * fVar24 + fVar12 * fVar23), 0.0 < fVar16))))
      {
        __return_storage_ptr__->exists = true;
        (__return_storage_ptr__->point).x = fVar15 * fVar16 + (float)uVar5;
        (__return_storage_ptr__->point).y = fVar21 * fVar16 + (float)uVar9;
        (__return_storage_ptr__->point).z = fVar1 + fVar18 * fVar16;
        __return_storage_ptr__->t = fVar16;
        return __return_storage_ptr__;
      }
    }
  }
  __return_storage_ptr__->exists = false;
  *(undefined3 *)&__return_storage_ptr__->field_0x1 = 0;
  (__return_storage_ptr__->point).x = 0.0;
  (__return_storage_ptr__->point).y = 0.0;
  (__return_storage_ptr__->point).z = 0.0;
  __return_storage_ptr__->t = 0.0;
  return __return_storage_ptr__;
}

Assistant:

IntersecRes intersectionT(Segment const& segment, Triangle const& triangle)
{
  Vector const D = normalize(segment.b - segment.a);

  Vector e1 = triangle.y - triangle.x;
  Vector e2 = triangle.z - triangle.x;

  Vector P = crossProduct(D, e2);
  float det = dotProduct(e1, P);

  if (isCloseToZero(det))
    return {false, {}};

  float inv_det = 1.f / det;
  Vector T = segment.a - triangle.x;
  float u = dotProduct(T, P) * inv_det;
  if (u < 0.f || u > 1.f)
    return {false, {}};

  Vector Q = crossProduct(T, e1);
  float v = dotProduct(D, Q) * inv_det;

  if (v < 0.f || u + v > 1.f)
    return {false, {}};

  float t = dotProduct(e2, Q) * inv_det;
  if (t > 0)
  {
    Point res = segment.a + D * t;
    return {true, res, t};
  }

  return {false, {}};
}